

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_start_write(nni_ws *ws)

{
  ws_frame *item;
  uint nio;
  undefined1 local_48 [8];
  nni_iov iov [2];
  
  if (ws->txframe != (ws_frame *)0x0) {
    return;
  }
  if (ws->ready == true) {
    item = (ws_frame *)nni_list_first(&ws->txq);
    if (item != (ws_frame *)0x0) {
      nni_list_remove(&ws->txq,item);
      ws->txframe = item;
      iov[0].iov_buf = (void *)item->hlen;
      local_48 = (undefined1  [8])item->head;
      if ((void *)item->len == (void *)0x0) {
        nio = 1;
      }
      else {
        iov[0].iov_len = (size_t)item->buf;
        nio = 2;
        iov[1].iov_buf = (void *)item->len;
      }
      nni_aio_set_iov(&ws->txaio,nio,(nni_iov *)local_48);
      nni_http_write_full(ws->http,&ws->txaio);
    }
  }
  return;
}

Assistant:

static void
ws_start_write(nni_ws *ws)
{
	ws_frame *frame;
	nni_iov   iov[2];
	int       niov;

	if ((ws->txframe != NULL) || (!ws->ready)) {
		return; // busy
	}

	if ((frame = nni_list_first(&ws->txq)) == NULL) {
		return; // nothing to send
	}
	NNI_ASSERT(frame != NULL);
	nni_list_remove(&ws->txq, frame);

	// Push it out.
	ws->txframe    = frame;
	niov           = 1;
	iov[0].iov_len = frame->hlen;
	iov[0].iov_buf = frame->head;
	if (frame->len > 0) {
		niov++;
		iov[1].iov_len = frame->len;
		iov[1].iov_buf = frame->buf;
	}
	nni_aio_set_iov(&ws->txaio, niov, iov);
	nni_http_write_full(ws->http, &ws->txaio);
}